

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

Block * __thiscall
CFG::Relooper::AddBlock(Relooper *this,Expression *CodeInit,Expression *SwitchConditionInit)

{
  int iVar1;
  Expression *local_40;
  Expression *CodeInit_local;
  Expression *SwitchConditionInit_local;
  unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_> local_28;
  __single_object block;
  
  local_40 = CodeInit;
  CodeInit_local = SwitchConditionInit;
  SwitchConditionInit_local = (Expression *)this;
  std::make_unique<CFG::Block,CFG::Relooper*,wasm::Expression*&,wasm::Expression*&>
            ((Relooper **)&local_28,&SwitchConditionInit_local,&local_40);
  iVar1 = this->BlockIdCounter;
  this->BlockIdCounter = iVar1 + 1;
  *(int *)((long)local_28._M_t.super___uniq_ptr_impl<CFG::Block,_std::default_delete<CFG::Block>_>.
                 _M_t.super__Tuple_impl<0UL,_CFG::Block_*,_std::default_delete<CFG::Block>_>.
                 super__Head_base<0UL,_CFG::Block_*,_false>._M_head_impl + 0x150) = iVar1;
  std::
  deque<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>,std::allocator<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>>
  ::emplace_back<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>
            ((deque<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>,std::allocator<std::unique_ptr<CFG::Block,std::default_delete<CFG::Block>>>>
              *)&this->Blocks,&local_28);
  std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>::~unique_ptr(&local_28);
  return (Block *)(tuple<CFG::Block_*,_std::default_delete<CFG::Block>_>)
                  local_28._M_t.super___uniq_ptr_impl<CFG::Block,_std::default_delete<CFG::Block>_>.
                  _M_t.super__Tuple_impl<0UL,_CFG::Block_*,_std::default_delete<CFG::Block>_>.
                  super__Head_base<0UL,_CFG::Block_*,_false>._M_head_impl;
}

Assistant:

Block* Relooper::AddBlock(wasm::Expression* CodeInit,
                          wasm::Expression* SwitchConditionInit) {

  auto block = std::make_unique<Block>(this, CodeInit, SwitchConditionInit);
  block->Id = BlockIdCounter++;
  auto* blockPtr = block.get();
  Blocks.push_back(std::move(block));
  return blockPtr;
}